

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidr.c++
# Opt level: O1

void __thiscall
kj::CidrRange::CidrRange
          (CidrRange *this,int family,ArrayPtr<const_unsigned_char> bits,uint bitCount)

{
  uint uVar1;
  ulong uVar2;
  Fault f;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  uint local_4c;
  Fault local_48;
  undefined1 local_40 [16];
  char *local_30;
  size_t local_28;
  bool local_20;
  
  this->family = family;
  this->bitCount = bitCount;
  local_40._0_8_ = &local_4c;
  local_4c = bitCount;
  if (family == 2) {
    local_40._8_4_ = 0x20;
    local_30 = " <= ";
    local_28 = 5;
    local_20 = bitCount < 0x21;
    if (!local_20) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
                (&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
                 ,0x4a,FAILED,"bitCount <= 32","_kjCondition,",
                 (DebugComparison<unsigned_int_&,_int> *)local_40);
      kj::_::Debug::Fault::fatal(&local_48);
    }
  }
  else {
    local_40._8_4_ = 0x80;
    local_30 = " <= ";
    local_28 = 5;
    local_20 = bitCount < 0x81;
    if (!local_20) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
                (&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
                 ,0x4c,FAILED,"bitCount <= 128","_kjCondition,",
                 (DebugComparison<unsigned_int_&,_int> *)local_40);
      kj::_::Debug::Fault::fatal(&local_48);
    }
  }
  local_40._0_8_ = bits.size_ << 3;
  local_40._8_8_ = &local_4c;
  local_30 = " >= ";
  local_28 = 5;
  local_20 = (uint *)(ulong)bitCount <= (ulong)local_40._0_8_;
  if (local_20) {
    uVar2 = (ulong)(bitCount + 7 >> 3);
    memcpy(this->bits,bits.ptr,uVar2);
    memset(this->bits + uVar2,0,0x10 - uVar2);
    uVar1 = this->bitCount;
    if (uVar1 < 0x80) {
      this->bits[uVar1 >> 3] = this->bits[uVar1 >> 3] & (byte)(0xff00 >> ((byte)uVar1 & 7));
      uVar2 = (ulong)(this->bitCount >> 3);
      memset(this->bits + uVar2 + 1,0,0xf - uVar2);
    }
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&>
            (&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
             ,0x4e,FAILED,"bits.size() * 8 >= bitCount","_kjCondition,",
             (DebugComparison<unsigned_long,_unsigned_int_&> *)local_40);
  kj::_::Debug::Fault::fatal(&local_48);
}

Assistant:

CidrRange::CidrRange(int family, ArrayPtr<const byte> bits, uint bitCount)
    : family(family), bitCount(bitCount) {
  if (family == AF_INET) {
    KJ_REQUIRE(bitCount <= 32);
  } else {
    KJ_REQUIRE(bitCount <= 128);
  }
  KJ_REQUIRE(bits.size() * 8 >= bitCount);
  size_t byteCount = (bitCount + 7) / 8;
  memcpy(this->bits, bits.begin(), byteCount);
  memset(this->bits + byteCount, 0, sizeof(this->bits) - byteCount);

  zeroIrrelevantBits();
}